

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O0

Vec_Int_t * Gia_SimCollectBest(Vec_Flt_t *vQuo)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float ValueMax;
  float Value;
  int i;
  Vec_Int_t *vRes;
  Vec_Flt_t *vQuo_local;
  
  fVar2 = Vec_FltFindMax(vQuo);
  if (0.0 < fVar2) {
    vQuo_local = (Vec_Flt_t *)Vec_IntAlloc(100);
    for (ValueMax = 0.0; iVar1 = Vec_FltSize(vQuo), (int)ValueMax < iVar1;
        ValueMax = (float)((int)ValueMax + 1)) {
      fVar3 = Vec_FltEntry(vQuo,(int)ValueMax);
      if ((fVar3 == fVar2) && (!NAN(fVar3) && !NAN(fVar2))) {
        Vec_IntPush((Vec_Int_t *)vQuo_local,(int)ValueMax);
      }
    }
  }
  else {
    vQuo_local = (Vec_Flt_t *)0x0;
  }
  return (Vec_Int_t *)vQuo_local;
}

Assistant:

Vec_Int_t * Gia_SimCollectBest( Vec_Flt_t * vQuo )
{
    Vec_Int_t * vRes; int i;
    float Value, ValueMax = Vec_FltFindMax( vQuo );
    if ( ValueMax <= 0 )
        return NULL;
    vRes = Vec_IntAlloc( 100 );  // variables with max quo
    Vec_FltForEachEntry( vQuo, Value, i )
        if ( Value == ValueMax )
            Vec_IntPush( vRes, i );
    return vRes;
}